

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_inflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGDecompressSettings *settings)

{
  uint uVar1;
  uchar *in_RCX;
  ucvector *in_RDX;
  size_t *in_RSI;
  undefined8 *in_RDI;
  size_t in_R8;
  ucvector v;
  uint error;
  ucvector local_48;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  ucvector_init_buffer(&local_48,(uchar *)*in_RDI,*in_RSI);
  uVar1 = lodepng_inflatev(in_RDX,in_RCX,in_R8,
                           (LodePNGDecompressSettings *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  *in_RDI = local_48.data;
  *in_RSI = local_48.size;
  return uVar1;
}

Assistant:

unsigned lodepng_inflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGDecompressSettings* settings) {
  unsigned error;
  ucvector v;
  ucvector_init_buffer(&v, *out, *outsize);
  error = lodepng_inflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}